

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall IteratorTest::hasMoreTest<false>(IteratorTest *this)

{
  int iVar1;
  bool bVar2;
  iterator local_108;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator(&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_108,&v);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=(&it,&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar1 = 0x18;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_108.view_._0_1_ =
         andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&it);
    test((bool *)&local_108);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++(&it);
  }
  bVar2 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore(&it);
  local_108.view_._0_1_ = !bVar2;
  test((bool *)&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&shape,1,(allocator_type *)&v);
  *shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::begin
            ((const_iterator *)&local_108,(View<int,_true,_std::allocator<unsigned_long>_> *)&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  iVar1 = 0x18;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_108.view_._0_1_ =
         andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                   ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    test((bool *)&local_108);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  bVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  local_108.view_._0_1_ = !bVar2;
  test((bool *)&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&shape_2,1,(allocator_type *)&v);
  *shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = 0x18;
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish,this->data_,&andres::defaultOrder,
             &andres::defaultOrder,(allocator_type *)&it);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin((iterator *)&shape,&v);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)&shape);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it,
             (Iterator<int,_true,_std::allocator<unsigned_long>_> *)&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_108.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_90);
  iVar1 = 0x18;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    local_108.view_._0_1_ =
         andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                   ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
    test((bool *)&local_108);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  }
  bVar2 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::hasMore
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)&it);
  local_108.view_._0_1_ = !bVar2;
  test((bool *)&local_108);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void IteratorTest::hasMoreTest() {
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it.hasMore());
            ++it;
        }
        test(!it.hasMore());
    }
}